

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.cpp
# Opt level: O3

void polyscope::error(string *message)

{
  pointer pcVar1;
  ostream *poVar2;
  logic_error *this;
  type func;
  _Any_data _Stack_68;
  code *local_58;
  undefined1 local_48 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  char local_28 [16];
  
  if (0 < options::verbosity) {
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,options::printPrefix_abi_cxx11_,DAT_004bac20);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"[ERROR] ",8);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(message->_M_dataplus)._M_p,message->_M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  if (options::errorsThrowExceptions != '\x01') {
    local_48._0_8_ = anon_unknown_1::buildErrorUI;
    local_48[8] = false;
    pcVar1 = (message->_M_dataplus)._M_p;
    local_38._M_allocated_capacity = (size_type)local_28;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_48 + 0x10),pcVar1,pcVar1 + message->_M_string_length);
    (**(code **)(*render::engine + 0x78))();
    std::function<void()>::
    function<std::_Bind<void(*(std::__cxx11::string,bool))(std::__cxx11::string,bool)>&,void>
              ((function<void()> *)_Stack_68._M_pod_data,
               (_Bind<void_(*(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool))(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool)>
                *)local_48);
    pushContext((function<void_()> *)&_Stack_68,false);
    if (local_58 != (code *)0x0) {
      (*local_58)(&_Stack_68,&_Stack_68,__destroy_functor);
    }
    if ((char *)local_38._M_allocated_capacity != local_28) {
      operator_delete((void *)local_38._M_allocated_capacity);
    }
    return;
  }
  this = (logic_error *)__cxa_allocate_exception(0x10);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &options::printPrefix_abi_cxx11_,message);
  std::logic_error::logic_error(this,(string *)local_48);
  __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void error(std::string message) {
  if (options::verbosity > 0) {
    std::cout << options::printPrefix << "[ERROR] " << message << std::endl;
  }

  if (options::errorsThrowExceptions) {
    throw std::logic_error(options::printPrefix + message);
  }

  auto func = std::bind(buildErrorUI, message, false);
  
  render::engine->showWindow();
  pushContext(func, false);
}